

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall
IntrusiveListIteratorTest_begin_end_backward_Test::TestBody
          (IntrusiveListIteratorTest_begin_end_backward_Test *this)

{
  TestObject *pTVar1;
  IntrusiveListIteratorTest *pIVar2;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar3;
  undefined1 auVar4 [16];
  unsigned_long uVar5;
  bool bVar6;
  int *lhs;
  undefined8 *puVar7;
  char *pcVar8;
  vector<int,_std::allocator<int>_> *in_R9;
  unsigned_long uVar9;
  TestObject *pTVar10;
  const_iterator first;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  int *local_68;
  IntrusiveListIteratorTest_begin_end_backward_Test *local_60;
  undefined8 *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  unsigned_long local_40;
  AssertHelper local_38;
  
  pTVar1 = (this->super_IntrusiveListIteratorTest).list_.first_;
  local_60 = this;
  lhs = (int *)operator_new(0xc);
  lhs[0] = 3;
  lhs[1] = 2;
  lhs[2] = 1;
  local_40 = 0;
  local_68 = lhs;
  if (pTVar1 != (TestObject *)0x0) {
    pIVar2 = &local_60->super_IntrusiveListIteratorTest;
    pTVar10 = (TestObject *)0x0;
    uVar5 = 1;
    do {
      uVar9 = uVar5;
      if (pTVar10 == (TestObject *)0x0) {
        pTVar10 = (TestObject *)&pIVar2->list_;
      }
      pTVar10 = (pTVar10->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
      if (pTVar10 == (TestObject *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                      ,0xa0,
                      "pointer wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator->() const [T = (anonymous namespace)::TestObject]"
                     );
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_58,"expected[count]","last->data",lhs,&pTVar10->data);
      if (local_58._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_70);
        if (local_50.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = ((local_50.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
                   ,0xae,pcVar8);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_70.ptr_ ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_001e25e4;
        goto LAB_001e25c6;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lhs = lhs + 1;
      uVar5 = uVar9 + 1;
      local_40 = uVar9;
    } while (pTVar10 != pTVar1);
  }
  local_70.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_58,"count","expected.size()",&local_40,(unsigned_long *)&local_70);
  if (local_58._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-intrusive-list.cc"
               ,0xb1,pcVar8);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_70.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_001e25c6:
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
    }
  }
LAB_001e25e4:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  operator_delete(local_68);
  pIVar2 = (IntrusiveListIteratorTest *)(local_60->super_IntrusiveListIteratorTest).clist_;
  piVar3 = (intrusive_list<(anonymous_namespace)::TestObject> *)
           (pIVar2->super_IntrusiveListTest).super_Test._vptr_Test;
  puVar7 = (undefined8 *)operator_new(0xc);
  local_50.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)puVar7 + 0xc);
  *puVar7 = 0x200000003;
  *(undefined4 *)(puVar7 + 1) = 1;
  first.node_ = (TestObject *)pIVar2;
  first.list_ = piVar3;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = &local_58;
  local_58 = puVar7;
  local_48 = local_50.ptr_;
  anon_unknown.dwarf_7b3f5::IntrusiveListIteratorTest::
  TestBackward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
            (pIVar2,first,(const_iterator)(auVar4 << 0x40),in_R9);
  operator_delete(puVar7);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, begin_end_backward) {
  TestBackward(list_.begin(), list_.end(), {3, 2, 1});
  TestBackward(clist_.begin(), clist_.end(), {3, 2, 1});
}